

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::
basic_csv_cursor<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
::read_next(basic_csv_cursor<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
            *this,basic_json_visitor<char> *visitor,error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  pointer data;
  error_code *in_RDX;
  text_source_adaptor<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  long in_RDI;
  span<const_char,_18446744073709551615UL> s;
  span<const_char,_18446744073709551615UL> local_28;
  
  basic_csv_parser<char,_std::allocator<char>_>::restart
            ((basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 0x48));
  do {
    bVar1 = basic_csv_parser<char,_std::allocator<char>_>::stopped
                      ((basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 0x48));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    bVar1 = basic_csv_parser<char,_std::allocator<char>_>::source_exhausted
                      ((basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 0x48));
    if (bVar1) {
      local_28 = text_source_adaptor<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::read_buffer(in_RSI,in_RDX);
      bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar1) {
        return;
      }
      sVar2 = jsoncons::detail::span<const_char,_18446744073709551615UL>::size(&local_28);
      if (sVar2 != 0) {
        data = jsoncons::detail::span<const_char,_18446744073709551615UL>::data(&local_28);
        sVar2 = jsoncons::detail::span<const_char,_18446744073709551615UL>::size(&local_28);
        basic_csv_parser<char,_std::allocator<char>_>::update
                  ((basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 0x48),data,sVar2);
      }
    }
    basic_csv_parser<char,_std::allocator<char>_>::parse_some
              ((basic_csv_parser<char,_std::allocator<char>_> *)ec,
               (basic_json_visitor<char> *)s.size_,(error_code *)s.data_);
    bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  } while (!bVar1);
  return;
}

Assistant:

void read_next(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        parser_.restart();
        while (!parser_.stopped())
        {
            if (parser_.source_exhausted())
            {
                auto s = source_.read_buffer(ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                if (s.size() > 0)
                {
                    parser_.update(s.data(),s.size());
                }
            }
            parser_.parse_some(visitor, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
        }
    }